

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O2

void InsertInterval(CostManager *manager,CostInterval *interval_in,float cost,int position,int start
                   ,int end)

{
  CostInterval *pCVar1;
  CostInterval *pCVar2;
  CostInterval **ppCVar3;
  CostManager *pCVar4;
  CostInterval *pCVar5;
  
  if (end <= start) {
    return;
  }
  if (499 < manager->count_) {
LAB_00141326:
    UpdateCostPerInterval(manager,start,end,position,cost);
    return;
  }
  pCVar2 = manager->free_intervals_;
  if (pCVar2 == (CostInterval *)0x0) {
    pCVar2 = manager->recycled_intervals_;
    if (pCVar2 == (CostInterval *)0x0) {
      pCVar2 = (CostInterval *)WebPSafeMalloc(1,0x20);
      if (pCVar2 == (CostInterval *)0x0) goto LAB_00141326;
      goto LAB_00141374;
    }
    ppCVar3 = &manager->recycled_intervals_;
  }
  else {
    ppCVar3 = &manager->free_intervals_;
  }
  *ppCVar3 = pCVar2->next_;
LAB_00141374:
  pCVar2->cost_ = cost;
  pCVar2->index_ = position;
  pCVar2->start_ = start;
  pCVar2->end_ = end;
  pCVar4 = manager;
  if (interval_in != (CostInterval *)0x0) goto LAB_001413b1;
  while( true ) {
    interval_in = pCVar4->head_;
LAB_001413b1:
    if ((interval_in == (CostInterval *)0x0) || (interval_in->start_ <= start)) break;
    pCVar4 = (CostManager *)&interval_in->previous_;
  }
  do {
    pCVar5 = interval_in;
    if (pCVar5 == (CostInterval *)0x0) {
      pCVar1 = manager->head_;
      pCVar2->next_ = pCVar1;
      if (pCVar1 != (CostInterval *)0x0) {
        pCVar1->previous_ = pCVar2;
      }
LAB_001413f3:
      pCVar4 = (CostManager *)&pCVar5->next_;
      if (pCVar5 == (CostInterval *)0x0) {
        pCVar4 = manager;
      }
      goto LAB_0014140c;
    }
    interval_in = pCVar5->next_;
    if (interval_in == (CostInterval *)0x0) {
      pCVar2->next_ = (CostInterval *)0x0;
      goto LAB_001413f3;
    }
  } while (interval_in->start_ < start);
  pCVar2->next_ = interval_in;
  interval_in->previous_ = pCVar2;
  pCVar4 = (CostManager *)&pCVar5->next_;
LAB_0014140c:
  pCVar4->head_ = pCVar2;
  pCVar2->previous_ = pCVar5;
  manager->count_ = manager->count_ + 1;
  return;
}

Assistant:

static WEBP_INLINE void InsertInterval(CostManager* const manager,
                                       CostInterval* const interval_in,
                                       float cost, int position, int start,
                                       int end) {
  CostInterval* interval_new;

  if (start >= end) return;
  if (manager->count_ >= COST_CACHE_INTERVAL_SIZE_MAX) {
    // Serialize the interval if we cannot store it.
    UpdateCostPerInterval(manager, start, end, position, cost);
    return;
  }
  if (manager->free_intervals_ != NULL) {
    interval_new = manager->free_intervals_;
    manager->free_intervals_ = interval_new->next_;
  } else if (manager->recycled_intervals_ != NULL) {
    interval_new = manager->recycled_intervals_;
    manager->recycled_intervals_ = interval_new->next_;
  } else {  // malloc for good
    interval_new = (CostInterval*)WebPSafeMalloc(1, sizeof(*interval_new));
    if (interval_new == NULL) {
      // Write down the interval if we cannot create it.
      UpdateCostPerInterval(manager, start, end, position, cost);
      return;
    }
  }

  interval_new->cost_ = cost;
  interval_new->index_ = position;
  interval_new->start_ = start;
  interval_new->end_ = end;
  PositionOrphanInterval(manager, interval_new, interval_in);

  ++manager->count_;
}